

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::SdfAnnotateTask::bindArgument
          (SdfAnnotateTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Compilation *comp;
  bool bVar1;
  Expression *pEVar2;
  undefined7 extraout_var;
  InvalidExpression *pIVar3;
  SourceRange sourceRange;
  Expression *local_20;
  
  if (argIndex != 1) {
    pEVar2 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
    return pEVar2;
  }
  comp = ((context->scope).ptr)->compilation;
  bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  if (!bVar1) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0xa000b,sourceRange);
    local_20 = (Expression *)0x0;
    pIVar3 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       (&comp->super_BumpAllocator,&local_20,comp->errorType);
    return &pIVar3->super_Expression;
  }
  pEVar2 = ArbitrarySymbolExpression::fromSyntax
                     (comp,(NameSyntax *)syntax,context,(bitmask<slang::ast::LookupFlags>)0x0);
  if (pEVar2->kind != ArbitrarySymbol) {
    return pEVar2;
  }
  if (((*(InstanceSymbol **)(pEVar2 + 1))->super_InstanceSymbolBase).super_Symbol.kind == Instance)
  {
    bVar1 = InstanceSymbol::isModule(*(InstanceSymbol **)(pEVar2 + 1));
    pIVar3 = (InvalidExpression *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      bVar1 = true;
      goto LAB_0040d0f4;
    }
  }
  bVar1 = Scope::isUninstantiated((context->scope).ptr);
  if (!bVar1) {
    ASTContext::addDiag(context,(DiagCode)0xa000b,pEVar2->sourceRange);
  }
  local_20 = pEVar2;
  pIVar3 = BumpAllocator::
           emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                     (&comp->super_BumpAllocator,&local_20,comp->errorType);
  bVar1 = false;
LAB_0040d0f4:
  if (bVar1) {
    return pEVar2;
  }
  return &pIVar3->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 1) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleInstance, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                              context);

            if (ref.kind == ExpressionKind::ArbitrarySymbol) {
                auto& sym = *ref.as<ArbitrarySymbolExpression>().symbol;
                if (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule()) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModuleInstance, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }